

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  time_t tVar1;
  char goGame;
  allocator local_7d9;
  string local_7d8;
  string local_7b8;
  Battle battle;
  Player computer;
  Player player;
  
  setlocale(6,"");
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  goGame = '0';
  while (goGame != '3') {
    UI::showMenu(&goGame);
    if (goGame == '1') {
      Battle::Battle(&battle);
      std::__cxx11::string::string((string *)&local_7b8,"human",(allocator *)&computer);
      Player::Player(&player,&local_7b8);
      std::__cxx11::string::~string((string *)&local_7b8);
      std::__cxx11::string::string((string *)&local_7d8,"AI",&local_7d9);
      Player::Player(&computer,&local_7d8);
      std::__cxx11::string::~string((string *)&local_7d8);
      Battle::initPlayers(&battle,&player,&computer);
      Battle::prepareForBattle(&battle);
      Battle::startBattle(&battle);
      Battle::finish(&battle);
      std::__cxx11::string::~string((string *)&computer);
      std::__cxx11::string::~string((string *)&player);
    }
  }
  return 0;
}

Assistant:

int main()
{
    setlocale(LC_ALL, "");
    srand(time(NULL));
    char goGame = '0';

    while(goGame != '3')
    {
        UI::showMenu(goGame);
        if(goGame == '1')
        {
            Battle battle;

            Player player("human"), computer("AI");
            battle.initPlayers(player,computer);

            battle.prepareForBattle();
            battle.startBattle();
            battle.finish();
        }

    }

    return 0;
}